

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  int local_214;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Y_test;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  X_test;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  X_train;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Y_train;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_198;
  vector<double,_std::allocator<double>_> coords;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  _Vector_base<double,_std::allocator<double>_> local_e8;
  GNB gnb;
  string predicted;
  
  std::__cxx11::string::string((string *)&local_108,"./../data/train_states.txt",(allocator *)&gnb);
  Load_State(&X_train,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string((string *)&local_128,"./../data/test_states.txt",(allocator *)&gnb);
  Load_State(&X_test,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_148,"./../data/train_labels.txt",(allocator *)&gnb);
  Load_Label(&Y_train,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_168,"./../data/test_labels.txt",(allocator *)&gnb);
  Load_Label(&Y_test,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  poVar2 = std::operator<<((ostream *)&std::cout,"X_train number of elements ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"X_train element size ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Y_train number of elements ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  GNB::GNB(&gnb);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_198,&X_train);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,&Y_train);
  GNB::train(&gnb,&local_198,&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_198);
  poVar2 = std::operator<<((ostream *)&std::cout,"X_test number of elements ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"X_test element size ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Y_test number of elements ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar4 = 0;
  local_214 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)X_test.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)X_test.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              (&coords,(vector<double,_std::allocator<double>_> *)
                       ((long)&((X_test.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,&coords);
    GNB::predict_abi_cxx11_(&predicted,&gnb,(vector<double,_std::allocator<double>_> *)&local_e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e8);
    iVar1 = std::__cxx11::string::compare((string *)&predicted);
    local_214 = local_214 + (uint)(iVar1 == 0);
    std::__cxx11::string::~string((string *)&predicted);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&coords.super__Vector_base<double,_std::allocator<double>_>);
    lVar4 = lVar4 + 0x18;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"You got ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((float)local_214 /
                             (float)(ulong)((long)Y_test.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)Y_test.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5)) *
                             100.0);
  poVar2 = std::operator<<(poVar2," correct");
  std::endl<char,std::char_traits<char>>(poVar2);
  GNB::~GNB(&gnb);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&Y_test);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&Y_train);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&X_test);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&X_train);
  return 0;
}

Assistant:

int main() {
    
    vector< vector<double> > X_train = Load_State("./../data/train_states.txt");
    vector< vector<double> > X_test  = Load_State("./../data/test_states.txt");
    vector< string > Y_train  = Load_Label("./../data/train_labels.txt");
    vector< string > Y_test   = Load_Label("./../data/test_labels.txt");
    
    cout << "X_train number of elements " << X_train.size() << endl;
	cout << "X_train element size " << X_train[0].size() << endl;
	cout << "Y_train number of elements " << Y_train.size() << endl << endl;

	GNB gnb = GNB();
	
	gnb.train(X_train, Y_train);

	cout << "X_test number of elements " << X_test.size() << endl;
	cout << "X_test element size " << X_test[0].size() << endl;
	cout << "Y_test number of elements " << Y_test.size() << endl << endl;
	
	int score = 0;
	for(int i = 0; i < X_test.size(); i++)
	{
		vector<double> coords = X_test[i];
		string predicted = gnb.predict(coords);
		if(predicted.compare(Y_test[i]) == 0)
		{
			score += 1;
		}
	}

	float fraction_correct = float(score) / Y_test.size();
	cout << "You got " << (100*fraction_correct) << " correct" << endl;

	return 0;
}